

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate
          (DrawElementsBaseVertexNegativeInvalidTypeArgumentTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  char *pcVar8;
  string local_df8 [32];
  char *local_dd8;
  MessageBuilder local_dd0;
  string local_c50;
  stringstream local_c30 [8];
  stringstream error_sstream_3;
  ostream local_c20;
  GLuint *local_aa8;
  GLvoid *offsets [1];
  GLsizei count;
  string local_a78 [32];
  char *local_a58;
  MessageBuilder local_a50;
  string local_8d0;
  stringstream local_8b0 [8];
  stringstream error_sstream_2;
  ostream local_8a0;
  undefined1 local_721;
  string local_700 [32];
  char *local_6e0;
  MessageBuilder local_6d8;
  string local_558;
  stringstream local_538 [8];
  stringstream error_sstream_1;
  ostream local_528;
  undefined1 local_3a9;
  string local_388 [32];
  char *local_368;
  MessageBuilder local_360;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream error_sstream;
  ostream local_1a0;
  uint local_28;
  ApiType local_24;
  GLenum error_code;
  uint local_1c;
  bool use_clientside_vertex_data;
  bool use_clientside_index_data;
  long lStack_18;
  int iteration;
  Functions *gl;
  DrawElementsBaseVertexNegativeInvalidTypeArgumentTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  do {
    if (3 < (int)local_1c) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    error_code._3_1_ = (local_1c & 1) != 0;
    error_code._2_1_ = (local_1c & 2) != 0;
    pRVar3 = deqp::Context::getRenderContext
                       ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context);
    local_24.m_bits = (*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES((ContextType)local_24.m_bits);
    if ((bVar1) || (((error_code._3_1_ & 1) == 0 && ((error_code._2_1_ & 1) == 0)))) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,(bool)(error_code._2_1_ & 1),
                 (bool)(error_code._3_1_ & 1));
      local_28 = 0;
      (**(code **)(lStack_18 + 0x570))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset);
      local_28 = (**(code **)(lStack_18 + 0x800))();
      if (local_28 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        poVar4 = std::operator<<(&local_1a0,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_1e0,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        poVar4 = std::operator<<(poVar4,(string *)&local_1e0);
        std::operator<<(poVar4," call");
        std::__cxx11::string::~string((string *)&local_1e0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        std::__cxx11::stringstream::str();
        local_368 = (char *)std::__cxx11::string::c_str();
        pMVar6 = tcu::MessageBuilder::operator<<(&local_360,&local_368);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [34])": expected GL_INVALID_ENUM, got:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_28);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string(local_388);
        tcu::MessageBuilder::~MessageBuilder(&local_360);
        local_3a9 = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar7,pcVar8,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xc8a);
        local_3a9 = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_18 + 0x5a8))
                (4,0,2,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      local_28 = (**(code **)(lStack_18 + 0x800))();
      if (local_28 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_538);
        poVar4 = std::operator<<(&local_528,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_558,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        poVar4 = std::operator<<(poVar4,(string *)&local_558);
        std::operator<<(poVar4," call");
        std::__cxx11::string::~string((string *)&local_558);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        std::__cxx11::stringstream::str();
        local_6e0 = (char *)std::__cxx11::string::c_str();
        pMVar6 = tcu::MessageBuilder::operator<<(&local_6d8,&local_6e0);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [34])": expected GL_INVALID_ENUM, got:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_28);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string(local_700);
        tcu::MessageBuilder::~MessageBuilder(&local_6d8);
        local_721 = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar7,pcVar8,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xca0);
        local_721 = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_18 + 0x590))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset);
      local_28 = (**(code **)(lStack_18 + 0x800))();
      if (local_28 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_8b0);
        poVar4 = std::operator<<(&local_8a0,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_8d0,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        poVar4 = std::operator<<(poVar4,(string *)&local_8d0);
        std::operator<<(poVar4," call");
        std::__cxx11::string::~string((string *)&local_8d0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_a50,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        std::__cxx11::stringstream::str();
        local_a58 = (char *)std::__cxx11::string::c_str();
        pMVar6 = tcu::MessageBuilder::operator<<(&local_a50,&local_a58);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [34])": expected GL_INVALID_ENUM, got:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_28);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string(local_a78);
        tcu::MessageBuilder::~MessageBuilder(&local_a50);
        offsets[0]._7_1_ = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar7,pcVar8,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xcb5);
        offsets[0]._7_1_ = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported & 1U)
          != 0) {
        offsets[0]._0_4_ = 3;
        local_aa8 = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
        (**(code **)(lStack_18 + 0xde8))(4,offsets,0,&local_aa8,1,0);
        local_28 = (**(code **)(lStack_18 + 0x800))();
        if (local_28 != 0x500) {
          std::__cxx11::stringstream::stringstream(local_c30);
          poVar4 = std::operator<<(&local_c20,"Invalid error code reported for an invalid ");
          DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                    (&local_c50,&this->super_DrawElementsBaseVertexTestBase,
                     FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX);
          poVar4 = std::operator<<(poVar4,(string *)&local_c50);
          std::operator<<(poVar4," call");
          std::__cxx11::string::~string((string *)&local_c50);
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                              super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_dd0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          std::__cxx11::stringstream::str();
          local_dd8 = (char *)std::__cxx11::string::c_str();
          pMVar6 = tcu::MessageBuilder::operator<<(&local_dd0,&local_dd8);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [34])": expected GL_INVALID_ENUM, got:[");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_28);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string(local_df8);
          tcu::MessageBuilder::~MessageBuilder(&local_dd0);
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          tcu::TestError::TestError
                    (pTVar7,pcVar8,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                     ,0xcce);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      local_28 = 0x500;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Try to execute the invalid draw calls */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES,												 /* mode */
								  3,														 /* count */
								  GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES,											  /* mode */
									   0,														  /* start */
									   2,														  /* end */
									   3,														  /* count */
									   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES,											 /* mode */
										   3,														 /* count */
										   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 1, /* instancecount */
										   0);														 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		if (m_is_ext_multi_draw_arrays_supported)
		{
			const glw::GLsizei count	 = 3;
			const glw::GLvoid* offsets[] = { (const glw::GLvoid*)m_draw_call_index_offset };

			gl.multiDrawElementsBaseVertex(GL_TRIANGLES,				/* mode */
										   &count, GL_NONE, offsets, 1, /* primcount */
										   0);							/* basevertex */

			error_code = gl.getError();
			if (error_code != GL_INVALID_ENUM)
			{
				std::stringstream error_sstream;

				error_sstream << "Invalid error code reported for an invalid "
							  << getFunctionName(FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX) << " call";

				m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
								   << ": expected GL_INVALID_ENUM, got:"
									  "["
								   << error_code << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL(error_sstream.str().c_str());
			}
		} /* if (m_is_ext_multi_draw_arrays_supported) */
	}	 /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}